

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reap.c
# Opt level: O0

_Bool nni_reap_sys_drain(void)

{
  _Bool local_9;
  _Bool result;
  
  local_9 = false;
  nni_mtx_lock(&reap_mtx);
  while (((reap_empty ^ 0xffU) & 1) != 0) {
    local_9 = true;
    nni_cv_wait(&reap_empty_cv);
  }
  nni_mtx_unlock(&reap_mtx);
  return local_9;
}

Assistant:

bool
nni_reap_sys_drain(void)
{
	bool result = false;
	nni_mtx_lock(&reap_mtx);
	while (!reap_empty) {
		result = true;
		nni_cv_wait(&reap_empty_cv);
	}
	nni_mtx_unlock(&reap_mtx);
	return (result);
}